

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restclient.h
# Opt level: O1

void __thiscall
hedg::Rest_Client::
send<boost::beast::http::message<true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>,hedg::params::market_catalogue>
          (Rest_Client *this,
          _func_void_message<true,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_ptr_market_catalogue
          *f,market_catalogue *p)

{
  string_view target_;
  market_catalogue mVar1;
  request<http::string_body> req;
  undefined1 in_stack_fffffffffffffe38 [104];
  _Alloc_hider _Var2;
  size_type sVar3;
  undefined1 uVar4;
  undefined7 in_stack_fffffffffffffeb1;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 in_stack_fffffffffffffeb8 [160];
  undefined1 auVar9 [32];
  
  target_.ptr_ = (p->end_point)._M_dataplus._M_p;
  target_.len_ = (p->end_point)._M_string_length;
  boost::beast::http::header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>::
  header<>((header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_> *)
           &stack0xfffffffffffffe40,post,target_,0xb);
  sVar3 = 0;
  uVar4 = '\0';
  _Var2._M_p = &stack0xfffffffffffffeb0;
  params::market_catalogue::market_catalogue((market_catalogue *)&stack0xfffffffffffffec0,p);
  mVar1.end_point._M_string_length = (size_type)_Var2._M_p;
  auVar5 = in_stack_fffffffffffffe38._0_32_;
  auVar6 = in_stack_fffffffffffffe38._32_32_;
  auVar7 = in_stack_fffffffffffffe38._64_32_;
  mVar1.session_id._M_dataplus._M_p = (pointer)auVar5._0_8_;
  mVar1.session_id._M_string_length = auVar5._8_8_;
  mVar1.session_id.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )auVar5._16_16_;
  mVar1.start_time._M_dataplus._M_p = (pointer)auVar6._0_8_;
  mVar1.start_time._M_string_length = auVar6._8_8_;
  mVar1.start_time.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )auVar6._16_16_;
  mVar1.end_time._M_dataplus._M_p = (pointer)auVar7._0_8_;
  mVar1.end_time._M_string_length = auVar7._8_8_;
  mVar1.end_time.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )auVar7._16_16_;
  mVar1.end_point._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe38._96_8_;
  mVar1.end_point.field_2._M_allocated_capacity = sVar3;
  mVar1.end_point.field_2._M_local_buf[8] = uVar4;
  mVar1.end_point.field_2._9_7_ = in_stack_fffffffffffffeb1;
  auVar5 = in_stack_fffffffffffffeb8._0_32_;
  auVar6 = in_stack_fffffffffffffeb8._32_32_;
  auVar7 = in_stack_fffffffffffffeb8._64_32_;
  auVar8 = in_stack_fffffffffffffeb8._96_32_;
  auVar9 = in_stack_fffffffffffffeb8._128_32_;
  mVar1.event_type_ids._M_dataplus._M_p = (pointer)auVar5._0_8_;
  mVar1.event_type_ids._M_string_length = auVar5._8_8_;
  mVar1.event_type_ids.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )auVar5._16_16_;
  mVar1.market_type_codes._M_dataplus._M_p = (pointer)auVar6._0_8_;
  mVar1.market_type_codes._M_string_length = auVar6._8_8_;
  mVar1.market_type_codes.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )auVar6._16_16_;
  mVar1.max_results._M_dataplus._M_p = (pointer)auVar7._0_8_;
  mVar1.max_results._M_string_length = auVar7._8_8_;
  mVar1.max_results.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )auVar7._16_16_;
  mVar1.market_projection._M_dataplus._M_p = (pointer)auVar8._0_8_;
  mVar1.market_projection._M_string_length = auVar8._8_8_;
  mVar1.market_projection.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )auVar8._16_16_;
  mVar1.market_countries._M_dataplus._M_p = (pointer)auVar9._0_8_;
  mVar1.market_countries._M_string_length = auVar9._8_8_;
  mVar1.market_countries.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )auVar9._16_16_;
  (*f)((message<true,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
        *)&stack0xfffffffffffffe40,mVar1);
  params::market_catalogue::~market_catalogue((market_catalogue *)&stack0xfffffffffffffec0);
  boost::beast::http::
  write<boost::asio::ssl::stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>
            (&(this->super_Client<hedg::Rest_Client>).sock_,
             (message<true,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
              *)&stack0xfffffffffffffe40);
  if (_Var2._M_p != &stack0xfffffffffffffeb0) {
    operator_delete(_Var2._M_p,CONCAT71(in_stack_fffffffffffffeb1,uVar4) + 1);
  }
  boost::beast::http::basic_fields<std::allocator<char>_>::~basic_fields
            ((basic_fields<std::allocator<char>_> *)&stack0xfffffffffffffe40);
  return;
}

Assistant:

void send(void(*f)(Buff&, T), T p) {
		http::request<http::string_body> req{ http::verb::post, p.end_point, 11 };
		f(req, p);
		http::write(sock_, req);
	}